

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_lsrk_varjac.c
# Opt level: O2

int dom_eig(sunrealtype t,N_Vector y,N_Vector fn,sunrealtype *lambdaR,sunrealtype *lambdaI,
           void *user_data,N_Vector temp1,N_Vector temp2,N_Vector temp3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = *user_data;
  dVar2 = *(double *)((long)user_data + 8);
  dVar3 = cos(((10.0 - t) / 10.0) * 3.141592653589793);
  *lambdaR = dVar1 - dVar3 * dVar2;
  *lambdaI = 0.0;
  return 0;
}

Assistant:

static int dom_eig(sunrealtype t, N_Vector y, N_Vector fn, sunrealtype* lambdaR,
                   sunrealtype* lambdaI, void* user_data, N_Vector temp1,
                   N_Vector temp2, N_Vector temp3)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype lambda = rdata[0]; /* set shortcut for stiffness parameter 1 */
  sunrealtype alpha  = rdata[1]; /* set shortcut for stiffness parameter 2 */
  *lambdaR =
    (lambda -
     alpha * COS((SUN_RCONST(10.0) - t) / SUN_RCONST(10.0) *
                 ACOS(SUN_RCONST(-1.0)))); /* access current solution value */
  *lambdaI = SUN_RCONST(0.0);

  return 0; /* return with success */
}